

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O0

int hintcmp(void *ai,void *aj)

{
  uint *puVar1;
  uint *puVar2;
  int local_34;
  int local_30;
  int local_2c;
  Hint *j;
  Hint *i;
  void *aj_local;
  void *ai_local;
  
  puVar1 = *ai;
  puVar2 = *aj;
  if (*puVar2 < *puVar1) {
    local_2c = 1;
  }
  else {
    if (*puVar1 < *puVar2) {
      local_30 = -1;
    }
    else {
      if (**(uint **)(puVar2 + 4) < **(uint **)(puVar1 + 4)) {
        local_34 = 1;
      }
      else {
        local_34 = 0;
        if (**(uint **)(puVar1 + 4) < **(uint **)(puVar2 + 4)) {
          local_34 = -1;
        }
      }
      local_30 = local_34;
    }
    local_2c = local_30;
  }
  return local_2c;
}

Assistant:

static int hintcmp(const void *ai, const void *aj) {
  Hint *i = *(Hint **)ai;
  Hint *j = *(Hint **)aj;
  return (i->depth > j->depth)
             ? 1
             : ((i->depth < j->depth)
                    ? -1
                    : ((i->rule->index > j->rule->index) ? 1 : ((i->rule->index < j->rule->index) ? -1 : 0)));
}